

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void cpptempl::parse(ostream *stream,string *templ_text,data_map *data)

{
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  *pvVar1;
  element_type *peVar2;
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  TokenType in_stack_00000014;
  size_t i;
  token_vector tree;
  token_vector tokens;
  token_vector *in_stack_00000310;
  string *in_stack_00000318;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  *pvVar3;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_> *this
  ;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  local_78;
  string local_50 [56];
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::vector((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
            *)0x1fe54e);
  std::__cxx11::string::string(local_50,in_RSI);
  tokenize(in_stack_00000318,in_stack_00000310);
  std::__cxx11::string::~string(local_50);
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::vector((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
            *)0x1fe589);
  parse_tree((token_vector *)
             tree.
             super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(token_vector *)i,in_stack_00000014);
  pvVar3 = (vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
            *)0x0;
  while( true ) {
    this = pvVar3;
    pvVar1 = (vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
              *)std::
                vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                ::size(&local_78);
    if (pvVar1 <= pvVar3) break;
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    operator[](&local_78,(size_type)this);
    peVar2 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1fe5df);
    (*peVar2->_vptr_Token[1])(peVar2,local_8,local_18);
    pvVar3 = (vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
              *)((long)&(this->
                        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::~vector(this);
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::~vector(this);
  return;
}

Assistant:

inline void parse(std::ostream &stream, std::string templ_text, data_map &data)
    {
        token_vector tokens ;
        tokenize(templ_text, tokens) ;
        token_vector tree ;
        parse_tree(tokens, tree) ;

        for (size_t i = 0 ; i < tree.size() ; ++i)
        {
            // Recursively calls gettext on each node in the tree.
            // gettext returns the appropriate text for that node.
            // for text, itself;
            // for variable, substitution;
            // for control statement, recursively gets kids
            tree[i]->gettext(stream, data) ;
        }
    }